

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

double __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  bVar2 = IsNumber(this);
  if (!bVar2) {
    __assert_fail("IsNumber()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x722,
                  "double rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (((this->data_).f.flags & 0x200) == 0) {
    if (((this->data_).f.flags & 0x20) == 0) {
      if (((this->data_).f.flags & 0x40) == 0) {
        if (((this->data_).f.flags & 0x80) == 0) {
          if (((this->data_).f.flags & 0x100) == 0) {
            __assert_fail("(data_.f.flags & kUint64Flag) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                          ,0x727,
                          "double rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::GetDouble() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                         );
          }
          uVar1 = *(undefined8 *)&this->data_;
          auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar3._0_8_ = uVar1;
          auVar3._12_4_ = 0x45300000;
          this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                       ((auVar3._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        }
        else {
          this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                       (double)*(long *)&this->data_;
        }
      }
      else {
        this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     (double)(this->data_).s.length;
      }
    }
    else {
      this_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   (double)(int)(this->data_).s.length;
    }
  }
  else {
    this_local = *(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)&(this->data_).n;
  }
  return (double)this_local;
}

Assistant:

double GetDouble() const {
        RAPIDJSON_ASSERT(IsNumber());
        if ((data_.f.flags & kDoubleFlag) != 0)                return data_.n.d;   // exact type, no conversion.
        if ((data_.f.flags & kIntFlag) != 0)                   return data_.n.i.i; // int -> double
        if ((data_.f.flags & kUintFlag) != 0)                  return data_.n.u.u; // unsigned -> double
        if ((data_.f.flags & kInt64Flag) != 0)                 return static_cast<double>(data_.n.i64); // int64_t -> double (may lose precision)
        RAPIDJSON_ASSERT((data_.f.flags & kUint64Flag) != 0);  return static_cast<double>(data_.n.u64); // uint64_t -> double (may lose precision)
    }